

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O3

void __thiscall
duckdb::DependencyManager::CleanupDependencies
          (DependencyManager *this,CatalogTransaction transaction,CatalogEntry *object)

{
  DependencyInfo *pDVar1;
  DependencyInfo *dep;
  DependencyInfo *info_00;
  vector<duckdb::DependencyInfo,_true> to_remove;
  CatalogEntryInfo info;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_> local_88;
  CatalogEntryInfo local_68;
  
  local_88.super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (DependencyInfo *)0x0;
  local_88.super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (DependencyInfo *)0x0;
  local_88.super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetLookupProperties(&local_68,object);
  local_a8._8_8_ = 0;
  local_90 = ::std::
             _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:342:15)>
             ::_M_invoke;
  local_98 = ::std::
             _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:342:15)>
             ::_M_manager;
  local_a8._M_unused._M_object = &local_88;
  ScanSetInternal(this,transaction,&local_68,true,(dependency_callback_t *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  local_a8._8_8_ = 0;
  local_90 = ::std::
             _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:344:17)>
             ::_M_invoke;
  local_98 = ::std::
             _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:344:17)>
             ::_M_manager;
  local_a8._M_unused._M_object = &local_88;
  ScanSetInternal(this,transaction,&local_68,false,(dependency_callback_t *)&local_a8);
  info_00 = local_88.
            super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = local_88.
           super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
    info_00 = local_88.
              super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pDVar1 = local_88.
             super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  for (; info_00 != pDVar1; info_00 = info_00 + 1) {
    RemoveDependency(this,transaction,info_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
    operator_delete(local_68.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.schema._M_dataplus._M_p != &local_68.schema.field_2) {
    operator_delete(local_68.schema._M_dataplus._M_p);
  }
  ::std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>::~vector(&local_88)
  ;
  return;
}

Assistant:

void DependencyManager::CleanupDependencies(CatalogTransaction transaction, CatalogEntry &object) {
	// Collect the dependencies
	vector<DependencyInfo> to_remove;

	auto info = GetLookupProperties(object);
	ScanSubjects(transaction, info,
	             [&](DependencyEntry &dep) { to_remove.push_back(DependencyInfo::FromSubject(dep)); });
	ScanDependents(transaction, info,
	               [&](DependencyEntry &dep) { to_remove.push_back(DependencyInfo::FromDependent(dep)); });

	// Remove the dependency entries
	for (auto &dep : to_remove) {
		RemoveDependency(transaction, dep);
	}
}